

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::RegexEs5MatchImpl<false>
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,bool noResult,void *stackAllocationPointer)

{
  Type TVar1;
  TrigramInfo *pTVar2;
  code *pcVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  uint16 uVar7;
  charcount_t inputLength_00;
  RegexPattern *this;
  char16 *input_00;
  TrigramAlphabet *this_00;
  TrigramInfo **ppTVar8;
  Program **ppPVar9;
  undefined4 *puVar10;
  Matcher **ppMVar11;
  Matcher *pMVar12;
  GroupInfo *pGVar13;
  JavascriptString **ppJVar14;
  JavascriptString *pJVar15;
  JavascriptLibrary *pJVar16;
  uint *puVar17;
  Var nonMatchValue_00;
  SparseArraySegmentBase *pSVar18;
  SparseArraySegmentBase *pSVar19;
  Var ptr;
  JavascriptArray *local_128;
  uint local_ec;
  uint groupId;
  Type *elements;
  Var nonMatchValue;
  int numGroups;
  JavascriptString *matchedString;
  uint local_c0;
  CharCountOrFlag local_bc;
  uint32 globalIndex;
  CharCount offset;
  RegexMatchState state;
  JavascriptArray *arrayResult;
  bool isSticky;
  bool isGlobal;
  JavascriptString *str;
  int k_1;
  int k;
  JavascriptArray *arrayResult_1;
  TrigramInfo *trigramInfo;
  TrigramAlphabet *trigramAlphabet;
  charcount_t cStack_58;
  GroupInfo lastActualMatch;
  GroupInfo lastSuccessfulMatch;
  CharCount inputLength;
  char16 *inputStr;
  RegexPattern *pattern;
  void *stackAllocationPointer_local;
  bool noResult_local;
  JavascriptString *input_local;
  JavascriptRegExp *regularExpression_local;
  ScriptContext *scriptContext_local;
  
  this = JavascriptRegExp::GetPattern(regularExpression);
  input_00 = JavascriptString::GetString(input);
  inputLength_00 = JavascriptString::GetLength(input);
  RegexHelperTrace(scriptContext,Match,regularExpression,input);
  UnifiedRegex::GroupInfo::GroupInfo(&lastActualMatch);
  UnifiedRegex::GroupInfo::GroupInfo((GroupInfo *)((long)&trigramAlphabet + 4));
  this_00 = ScriptContext::GetTrigramAlphabet(scriptContext);
  ppTVar8 = Memory::WriteBarrierPtr::operator_cast_to_TrigramInfo__
                      ((WriteBarrierPtr *)&(this->rep).unified.trigramInfo);
  pTVar2 = *ppTVar8;
  if (((this_00 != (TrigramAlphabet *)0x0) && (249999 < inputLength_00)) &&
     (pTVar2 != (TrigramInfo *)0x0)) {
    if (this_00->input == (char16 *)0x0) {
      UnifiedRegex::TrigramAlphabet::MegaMatch(this_00,input_00,inputLength_00);
    }
    if ((pTVar2->isTrigramPattern & 1U) != 0) {
      if (0 < pTVar2->resultCount) {
        lastActualMatch.length = 8;
        lastActualMatch.offset = pTVar2->offsets[pTVar2->resultCount + -1];
      }
      ppPVar9 = Memory::WriteBarrierPtr::operator_cast_to_Program__
                          ((WriteBarrierPtr *)&(this->rep).unified);
      if (*ppPVar9 == (Program *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x1dc,"(pattern->rep.unified.program != 0)",
                                    "pattern->rep.unified.program != 0");
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      ppMVar11 = Memory::WriteBarrierPtr::operator_cast_to_Matcher__
                           ((WriteBarrierPtr *)&(this->rep).unified.matcher);
      if (*ppMVar11 == (Matcher *)0x0) {
        pMVar12 = UnifiedRegex::Matcher::New(scriptContext,this);
        Memory::WriteBarrierPtr<UnifiedRegex::Matcher>::operator=
                  (&(this->rep).unified.matcher,pMVar12);
      }
      pMVar12 = Memory::WriteBarrierPtr<UnifiedRegex::Matcher>::operator->
                          (&(this->rep).unified.matcher);
      pGVar13 = UnifiedRegex::Matcher::GroupIdToGroupInfo(pMVar12,0);
      *pGVar13 = lastActualMatch;
      bVar5 = UnifiedRegex::RegexPattern::IsGlobal(this);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x1e1,"(pattern->IsGlobal())","pattern->IsGlobal()");
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      uVar7 = UnifiedRegex::RegexPattern::NumGroups(this);
      local_128 = CreateMatchResult(stackAllocationPointer,scriptContext,true,(uint)uVar7,input);
      FinalizeMatchResult(scriptContext,true,local_128,lastActualMatch);
      if (0 < pTVar2->resultCount) {
        if ((pTVar2->hasCachedResultString & 1U) == 0) {
          for (str._0_4_ = 0; (int)(uint32)str < pTVar2->resultCount; str._0_4_ = (uint32)str + 1) {
            pJVar15 = SubString::New(input,pTVar2->offsets[(int)(uint32)str],8);
            Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
                      (pTVar2->cachedResult + (int)(uint32)str,pJVar15);
            Js::JavascriptArray::DirectSetItemAt<Js::JavascriptString*>
                      (local_128,(uint32)str,pJVar15);
          }
          pTVar2->hasCachedResultString = true;
        }
        else {
          for (str._4_4_ = 0; (int)str._4_4_ < pTVar2->resultCount; str._4_4_ = str._4_4_ + 1) {
            ppJVar14 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptString__
                                 ((WriteBarrierPtr *)(pTVar2->cachedResult + (int)str._4_4_));
            Js::JavascriptArray::DirectSetItemAt<Js::JavascriptString*>
                      (local_128,str._4_4_,*ppJVar14);
          }
        }
      }
      bVar5 = UnifiedRegex::GroupInfo::IsUndefined(&lastActualMatch);
      if (bVar5) {
        pJVar16 = ScriptContext::GetLibrary(scriptContext);
        local_128 = (JavascriptArray *)
                    JavascriptLibraryBase::GetNull(&pJVar16->super_JavascriptLibraryBase);
      }
      return local_128;
    }
  }
  bVar5 = UnifiedRegex::RegexPattern::IsGlobal(this);
  bVar6 = UnifiedRegex::RegexPattern::IsSticky(this);
  state.matcher = (Matcher *)0x0;
  local_bc = 0;
  if ((!bVar5) && (bVar6)) {
    local_bc = JavascriptRegExp::GetLastIndex(regularExpression);
  }
  local_c0 = 0;
  PrimBeginMatch((RegexMatchState *)&globalIndex,scriptContext,this,input_00,inputLength_00,false);
  do {
    if (inputLength_00 < local_bc) {
      UnifiedRegex::GroupInfo::Reset((GroupInfo *)((long)&trigramAlphabet + 4));
      break;
    }
    matchedString =
         (JavascriptString *)
         PrimMatch((RegexMatchState *)&globalIndex,scriptContext,this,inputLength_00,local_bc);
    unique0x10000861 = (GroupInfo)matchedString;
    bVar6 = UnifiedRegex::GroupInfo::IsUndefined((GroupInfo *)((long)&trigramAlphabet + 4));
    if (bVar6) break;
    lastActualMatch = stack0xffffffffffffffa4;
    if (!noResult) {
      if (state.matcher == (Matcher *)0x0) {
        uVar7 = UnifiedRegex::RegexPattern::NumGroups(this);
        state.matcher =
             (Matcher *)
             CreateMatchResult(stackAllocationPointer,scriptContext,bVar5,(uint)uVar7,input);
      }
      _numGroups = SubString::New(input,trigramAlphabet._4_4_,cStack_58);
      uVar4 = local_c0;
      if (bVar5) {
        Js::JavascriptArray::DirectSetItemAt<Js::JavascriptString*>
                  ((JavascriptArray *)state.matcher,local_c0,_numGroups);
      }
      else {
        pSVar18 = Js::JavascriptArray::GetHead((JavascriptArray *)state.matcher);
        if (pSVar18->length <= uVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                      ,0x22f,"(globalIndex < arrayResult->GetHead()->length)",
                                      "globalIndex < arrayResult->GetHead()->length");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        pJVar15 = _numGroups;
        pSVar18 = Js::JavascriptArray::GetHead((JavascriptArray *)state.matcher);
        Memory::WriteBarrierPtr<void>::operator=
                  ((WriteBarrierPtr<void> *)(&pSVar18[1].left + (ulong)local_c0 * 2),pJVar15);
      }
      local_c0 = local_c0 + 1;
    }
    TVar1 = trigramAlphabet._4_4_;
    nonMatchValue._4_4_ = 1;
    puVar17 = max<unsigned_int>(&cStack_58,(uint *)((long)&nonMatchValue + 4));
    local_bc = TVar1 + *puVar17;
  } while (bVar5);
  PrimEndMatch((RegexMatchState *)&globalIndex,scriptContext,this);
  if (state.matcher == (Matcher *)0x0) {
    pJVar16 = ScriptContext::GetLibrary(scriptContext);
    scriptContext_local =
         (ScriptContext *)JavascriptLibraryBase::GetNull(&pJVar16->super_JavascriptLibraryBase);
  }
  else {
    uVar7 = UnifiedRegex::RegexPattern::NumGroups(this);
    nonMatchValue._0_4_ = (uint)uVar7;
    if (bVar5) {
      FinalizeMatchResult(scriptContext,true,(JavascriptArray *)state.matcher,lastActualMatch);
    }
    else {
      if (1 < (uint)nonMatchValue) {
        nonMatchValue_00 = NonMatchValue(scriptContext,false);
        pSVar18 = Js::JavascriptArray::GetHead((JavascriptArray *)state.matcher);
        for (local_ec = 1; local_ec < (uint)nonMatchValue; local_ec = local_ec + 1) {
          pSVar19 = Js::JavascriptArray::GetHead((JavascriptArray *)state.matcher);
          TVar1 = pSVar19->left;
          pSVar19 = Js::JavascriptArray::GetHead((JavascriptArray *)state.matcher);
          if (TVar1 + pSVar19->length <= local_ec) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                        ,0x24b,
                                        "(groupId < arrayResult->GetHead()->left + arrayResult->GetHead()->length)"
                                        ,
                                        "groupId < arrayResult->GetHead()->left + arrayResult->GetHead()->length"
                                       );
            if (!bVar5) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          ptr = GetGroup(scriptContext,this,input,nonMatchValue_00,local_ec);
          Memory::WriteBarrierPtr<void>::operator=
                    ((WriteBarrierPtr<void> *)(&pSVar18[1].left + (ulong)local_ec * 2),ptr);
        }
      }
      FinalizeMatchResult(scriptContext,false,(JavascriptArray *)state.matcher,lastActualMatch);
    }
    scriptContext_local = (ScriptContext *)state.matcher;
  }
  return scriptContext_local;
}

Assistant:

Var RegexHelper::RegexEs5MatchImpl(ScriptContext* scriptContext, JavascriptRegExp *regularExpression, JavascriptString *input, bool noResult, void *const stackAllocationPointer)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Match, regularExpression, input);
#endif

        UnifiedRegex::GroupInfo lastSuccessfulMatch; // initially undefined
        UnifiedRegex::GroupInfo lastActualMatch; // initially undefined

#ifdef REGEX_TRIGRAMS
        UnifiedRegex::TrigramAlphabet* trigramAlphabet = scriptContext->GetTrigramAlphabet();
        UnifiedRegex::TrigramInfo* trigramInfo = pattern->rep.unified.trigramInfo;
        if (trigramAlphabet != NULL && inputLength >= MinTrigramInputLength && trigramInfo != NULL)
        {
            if (trigramAlphabet->input == NULL)
            {
                trigramAlphabet->MegaMatch((char16*)inputStr, inputLength);
            }
            if (trigramInfo->isTrigramPattern)
            {
                if (trigramInfo->resultCount > 0)
                {
                    lastSuccessfulMatch.offset = trigramInfo->offsets[trigramInfo->resultCount - 1];
                    lastSuccessfulMatch.length = UnifiedRegex::TrigramInfo::PatternLength;
                }
                // else: leave lastMatch undefined

                // Make sure a matcher is allocated and holds valid last match in case the RegExp constructor
                // needs to fill-in details from the last match via JavascriptRegExpConstructor::EnsureValues
                Assert(pattern->rep.unified.program != 0);
                if (pattern->rep.unified.matcher == 0)
                    pattern->rep.unified.matcher = UnifiedRegex::Matcher::New(scriptContext, pattern);
                *pattern->rep.unified.matcher->GroupIdToGroupInfo(0) = lastSuccessfulMatch;

                Assert(pattern->IsGlobal());

                JavascriptArray* arrayResult = CreateMatchResult(stackAllocationPointer, scriptContext, /* isGlobal */ true, pattern->NumGroups(), input);
                FinalizeMatchResult(scriptContext, /* isGlobal */ true, arrayResult, lastSuccessfulMatch);

                if (trigramInfo->resultCount > 0)
                {
                    if (trigramInfo->hasCachedResultString)
                    {
                        for (int k = 0; k < trigramInfo->resultCount; k++)
                        {
                            arrayResult->DirectSetItemAt(k,
                                static_cast<Js::JavascriptString*>(trigramInfo->cachedResult[k]));
                        }
                    }
                    else
                    {
                        for (int k = 0; k < trigramInfo->resultCount; k++)
                        {
                            JavascriptString * str = SubString::New(input, trigramInfo->offsets[k], UnifiedRegex::TrigramInfo::PatternLength);
                            trigramInfo->cachedResult[k] = str;
                            arrayResult->DirectSetItemAt(k, str);
                        }
                        trigramInfo->hasCachedResultString = true;
                    }
                } // otherwise, there are no results and null will be returned

                if (updateHistory)
                {
                    PropagateLastMatch(scriptContext, /* isGlobal */ true, pattern->IsSticky(), regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
                }

                return lastSuccessfulMatch.IsUndefined() ? scriptContext->GetLibrary()->GetNull() : arrayResult;
            }
        }
#endif

        // If global regex, result array holds substrings for each match, and group bindings are ignored
        // If non-global regex, result array holds overall substring and each group binding substring

        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();
        JavascriptArray* arrayResult = 0;
        RegexMatchState state;

        // If global = false and sticky = true, set offset = lastIndex, else set offset = 0
        CharCount offset = 0;
        if (!isGlobal && isSticky)
        {
            offset = regularExpression->GetLastIndex();
        }

        uint32 globalIndex = 0;
        PrimBeginMatch(state, scriptContext, pattern, inputStr, inputLength, false);

        do
        {
            if (offset > inputLength)
            {
                lastActualMatch.Reset();
                break;
            }
            lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

            if (lastActualMatch.IsUndefined())
                break;
            lastSuccessfulMatch = lastActualMatch;
            if (!noResult)
            {
                if (arrayResult == 0)
                    arrayResult = CreateMatchResult(stackAllocationPointer, scriptContext, isGlobal, pattern->NumGroups(), input);
                JavascriptString *const matchedString = SubString::New(input, lastActualMatch.offset, lastActualMatch.length);
                if (isGlobal)
                    arrayResult->DirectSetItemAt(globalIndex, matchedString);
                else
                {
                    // The array's head segment up to length - 1 may not be filled. Write to the head segment element directly
                    // instead of calling a helper that expects the segment to be pre-filled.
                    Assert(globalIndex < arrayResult->GetHead()->length);
                    static_cast<SparseArraySegment<Var> *>(arrayResult->GetHead())->elements[globalIndex] = matchedString;
                }
                globalIndex++;
            }
            offset = lastActualMatch.offset + max(lastActualMatch.length, static_cast<CharCountOrFlag>(1));
        } while (isGlobal);
        PrimEndMatch(state, scriptContext, pattern);
        if (updateHistory)
        {
            PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
        }

        if (arrayResult == 0)
        {
            return scriptContext->GetLibrary()->GetNull();
        }

        const int numGroups = pattern->NumGroups();
        if (!isGlobal)
        {
            if (numGroups > 1)
            {
                // Overall match already captured in index 0 by above, so just grab the groups
                Var nonMatchValue = NonMatchValue(scriptContext, false);
                Field(Var) *elements = ((SparseArraySegment<Var>*)arrayResult->GetHead())->elements;
                for (uint groupId = 1; groupId < (uint)numGroups; groupId++)
                {
                    Assert(groupId < arrayResult->GetHead()->left + arrayResult->GetHead()->length);
                    elements[groupId] = GetGroup(scriptContext, pattern, input, nonMatchValue, groupId);
                }
            }
            FinalizeMatchResult(scriptContext, /* isGlobal */ false, arrayResult, lastSuccessfulMatch);
        }
        else
        {
            FinalizeMatchResult(scriptContext, /* isGlobal */ true, arrayResult, lastSuccessfulMatch);
        }

        return arrayResult;
    }